

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O2

void testReadDeep(string *tempdir)

{
  int channelCount;
  Compression compression;
  int iVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  undefined8 extraout_RAX;
  int *c;
  exr_chunk_info_t *func;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  exr_context_t f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampdata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packed;
  string fn;
  exr_chunk_info_t cinfo;
  undefined8 local_b8;
  code *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  DeepScanLineInputFile file;
  
  std::__cxx11::string::string((string *)&fn,(string *)tempdir);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_58 = 0;
  local_b8 = 0x68;
  uStack_60 = 0xbf800000fffffffe;
  local_b0 = anon_unknown.dwarf_3813e::err_cb;
  std::__cxx11::string::append((char *)&fn);
  packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
      remove(fn._M_dataplus._M_p);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
    func = (exr_chunk_info_t *)&DAT_00317d90;
    channelCount = (&DAT_00317d90)[lVar2];
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      compression = (&DAT_00317da0)[lVar9];
      anon_unknown.dwarf_3813e::generateRandomScanFile(&fn,channelCount,compression);
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile(&file,fn._M_dataplus._M_p,8);
      Imf_3_4::DeepScanLineInputFile::~DeepScanLineInputFile(&file);
      iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_b8);
      if (iVar1 != 0) {
LAB_00118939:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x1ba,0x317b49,
                       (char *)func);
LAB_0011899a:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_deep_chunk (f, 0, &cinfo, &packed[0], __null)",(char *)0x1d8,
                       0x317b49,(char *)func);
LAB_001189fb:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0])",(char *)0x1c1,
                       0x317b49,(char *)func);
LAB_00118a5c:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_tile_chunk_info (f, 0, 0, 1, 0, 0, &cinfo)",(char *)0x1e2,0x317b49,
                       (char *)func);
LAB_00118abd:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x1df,0x317b49,
                       (char *)func);
LAB_00118b1e:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_deep_chunk (f, 0, &cinfo, __null, &sampdata[0])",(char *)0x1da,
                       0x317b49,(char *)func);
LAB_00118b7f:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0])",(char *)0x1e6,
                       0x317b49,(char *)func);
LAB_00118be0:
        core_test_fail("N == width",(char *)0x1c7,0x317b49,(char *)func);
LAB_00118bf8:
        core_test_fail("packed.size () == (sampcount[N - 1]) * bps",(char *)0x1cf,0x317b49,
                       (char *)func);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&fn);
        _Unwind_Resume(extraout_RAX);
      }
      func = &cinfo;
      iVar1 = exr_read_scanline_chunk_info(f,0,0x5f);
      if (iVar1 != 0) {
LAB_001188d8:
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_scanline_chunk_info (f, 0, minY + height / 2, &cinfo)",
                       (char *)0x1bd,0x317b49,(char *)func);
        goto LAB_00118939;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&packed,cinfo.packed_size);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&sampdata,cinfo.sample_count_table_size);
      func = (exr_chunk_info_t *)
             packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      iVar1 = exr_read_deep_chunk(f,0,&cinfo,
                                  packed.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  sampdata.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      if (iVar1 != 0) goto LAB_001189fb;
      if (lVar9 == 0) {
        func = (exr_chunk_info_t *)
               ((long)sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)sampdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffffc);
        if (func == (exr_chunk_info_t *)0x444) {
          lVar6 = 0;
          for (piVar5 = (anonymous_namespace)::channelTypes; piVar5 != DAT_00337a18;
              piVar5 = piVar5 + 1) {
            iVar1 = *piVar5;
            lVar7 = lVar6 + 4;
            if (iVar1 != 0) {
              lVar7 = lVar6;
            }
            lVar8 = lVar7 + 2;
            if (iVar1 != 1) {
              lVar8 = lVar7;
            }
            lVar6 = lVar8 + 4;
            if (iVar1 != 2) {
              lVar6 = lVar8;
            }
          }
          func = (exr_chunk_info_t *)
                 (packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                 -(long)packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
          if (func != (exr_chunk_info_t *)
                      (lVar6 * (ulong)*(uint *)(sampdata.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 0x440)))
          goto LAB_00118bf8;
          goto LAB_0011869f;
        }
        goto LAB_00118be0;
      }
LAB_0011869f:
      func = &cinfo;
      iVar1 = exr_read_scanline_chunk_info(f,0,0x35);
      if (iVar1 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_read_scanline_chunk_info (f, 0, minY + height / 4, &cinfo)",
                       (char *)0x1d3,0x317b49,(char *)func);
        goto LAB_001188d8;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&packed,cinfo.packed_size);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&sampdata,cinfo.sample_count_table_size);
      func = (exr_chunk_info_t *)
             packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      iVar1 = exr_read_deep_chunk(f,0,&cinfo,
                                  packed.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,0);
      if (iVar1 != 0) goto LAB_0011899a;
      func = (exr_chunk_info_t *)0x0;
      iVar1 = exr_read_deep_chunk(f,0,&cinfo,0,
                                  sampdata.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      if (iVar1 != 0) goto LAB_00118b1e;
      exr_finish(&f);
      anon_unknown.dwarf_3813e::generateRandomTileFile(&fn,channelCount,compression);
      iVar1 = exr_start_read(&f,fn._M_dataplus._M_p,&local_b8);
      if (iVar1 != 0) goto LAB_00118abd;
      func = (exr_chunk_info_t *)0x1;
      iVar1 = exr_read_tile_chunk_info(f,0,0,1,0,0,&cinfo);
      if (iVar1 != 0) goto LAB_00118a5c;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&packed,cinfo.packed_size);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&sampdata,cinfo.sample_count_table_size);
      func = (exr_chunk_info_t *)
             packed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
      iVar1 = exr_read_deep_chunk(f,0,&cinfo,
                                  packed.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  sampdata.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
      if (iVar1 != 0) goto LAB_00118b7f;
      exr_finish(&f);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void
testReadDeep (const std::string& tempdir)
{
    std::string fn = tempdir;

    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "randomtempdeep.exr";

    int         chancounts[] = {1, 3, 10, 0};
    Compression comps[] = {NO_COMPRESSION, RLE_COMPRESSION, ZIPS_COMPRESSION};
    std::vector<uint8_t> packed;
    std::vector<uint8_t> sampdata;
    exr_chunk_info_t     cinfo;

    for (int c = 0; chancounts[c] > 0; ++c)
    {
        for (int cp = 0; cp < 3; ++cp)
        {
            generateRandomScanFile (fn, chancounts[c], comps[cp]);
            try
            {
                DeepScanLineInputFile file (fn.c_str (), 8);
            }
            catch (std::exception& e)
            {
                std::cerr << "ERROR: c++ unable to open generated deep scane"
                          << e.what () << std::endl;
            }

            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

            EXRCORE_TEST_RVAL (
                exr_read_scanline_chunk_info (f, 0, minY + height / 2, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0]));
            if (comps[cp] == NO_COMPRESSION)
            {
                const uint32_t* sampcount =
                    reinterpret_cast<const uint32_t*> (sampdata.data ());
                size_t N = sampdata.size () / sizeof (uint32_t);
                EXRCORE_TEST (N == width);
                size_t bps = 0;
                for (auto& c: channelTypes)
                {
                    if (c == 0) bps += sizeof (uint32_t);
                    if (c == 1) bps += sizeof (uint16_t);
                    if (c == 2) bps += sizeof (float);
                }
                EXRCORE_TEST (packed.size () == (sampcount[N - 1]) * bps);
            }

            EXRCORE_TEST_RVAL (
                exr_read_scanline_chunk_info (f, 0, minY + height / 4, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            // we support reading the two bits separately
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], NULL));
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, NULL, &sampdata[0]));

            exr_finish (&f);

            generateRandomTileFile (fn, chancounts[c], comps[cp]);
            EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));

            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, 0, 1, 0, 0, &cinfo));
            packed.resize (cinfo.packed_size);
            sampdata.resize (cinfo.sample_count_table_size);
            EXRCORE_TEST_RVAL (
                exr_read_deep_chunk (f, 0, &cinfo, &packed[0], &sampdata[0]));

            exr_finish (&f);
        }
    }
    remove (fn.c_str ());
}